

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

bool __thiscall
httplib::SSLClient::verify_host_with_subject_alt_name(SSLClient *this,X509 *server_cert)

{
  ulong __n;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  GENERAL_NAMES *a;
  int *piVar5;
  char *__s;
  size_t sVar6;
  undefined8 uVar7;
  undefined4 extraout_var_00;
  byte bVar8;
  int iVar9;
  in_addr addr;
  in6_addr addr6;
  undefined1 local_5c [4];
  undefined8 local_58;
  ulong local_50;
  SSLClient *local_48;
  undefined1 local_40 [16];
  undefined4 extraout_var;
  
  iVar2 = inet_pton(10,(this->super_Client).host_._M_dataplus._M_p,local_40);
  if (iVar2 == 0) {
    iVar2 = inet_pton(2,(this->super_Client).host_._M_dataplus._M_p,local_5c);
    local_50 = (ulong)((uint)(iVar2 != 0) * 4);
    iVar2 = (uint)(iVar2 != 0) * 5 + 2;
  }
  else {
    iVar2 = 7;
    local_50 = 0x10;
  }
  bVar8 = 0;
  a = (GENERAL_NAMES *)X509_get_ext_d2i((X509 *)server_cert,0x55,(int *)0x0,(int *)0x0);
  if (a != (GENERAL_NAMES *)0x0) {
    local_48 = this;
    iVar3 = OPENSSL_sk_num(a);
    if (iVar3 < 1) {
      bVar8 = 0;
    }
    else {
      iVar9 = 1;
      bVar1 = false;
      local_58 = 0;
      do {
        piVar5 = (int *)OPENSSL_sk_value(a,iVar9 + -1);
        if (*piVar5 == iVar2) {
          __s = (char *)ASN1_STRING_get0_data(*(undefined8 *)(piVar5 + 2));
          iVar4 = ASN1_STRING_length(*(ASN1_STRING **)(piVar5 + 2));
          sVar6 = strlen(__s);
          __n = local_50;
          if (sVar6 == (long)iVar4) {
            if (iVar2 == 7) {
              iVar4 = bcmp(local_40,__s,local_50);
              uVar7 = CONCAT44(extraout_var,iVar4);
              if (iVar4 != 0) {
                iVar4 = bcmp(local_5c,__s,__n);
                uVar7 = CONCAT44(extraout_var_00,iVar4);
                if (iVar4 != 0) goto LAB_0016c674;
              }
              local_58 = CONCAT71((int7)((ulong)uVar7 >> 8),1);
            }
            else if (iVar2 == 2) {
              bVar1 = check_host_name(local_48,__s,(long)iVar4);
            }
          }
        }
LAB_0016c674:
      } while ((iVar9 < iVar3) && (iVar9 = iVar9 + 1, bVar1 == false));
      bVar8 = bVar1 | (byte)local_58;
    }
  }
  GENERAL_NAMES_free(a);
  return (bool)(bVar8 & 1);
}

Assistant:

inline bool
SSLClient::verify_host_with_subject_alt_name(X509 *server_cert) const {
  auto ret = false;

  auto type = GEN_DNS;

  struct in6_addr addr6;
  struct in_addr addr;
  size_t addr_len = 0;

#ifndef __MINGW32__
  if (inet_pton(AF_INET6, host_.c_str(), &addr6)) {
    type = GEN_IPADD;
    addr_len = sizeof(struct in6_addr);
  } else if (inet_pton(AF_INET, host_.c_str(), &addr)) {
    type = GEN_IPADD;
    addr_len = sizeof(struct in_addr);
  }
#endif

  auto alt_names = static_cast<const struct stack_st_GENERAL_NAME *>(
      X509_get_ext_d2i(server_cert, NID_subject_alt_name, nullptr, nullptr));

  if (alt_names) {
    auto dsn_matched = false;
    auto ip_mached = false;

    auto count = sk_GENERAL_NAME_num(alt_names);

    for (auto i = 0; i < count && !dsn_matched; i++) {
      auto val = sk_GENERAL_NAME_value(alt_names, i);
      if (val->type == type) {
        auto name = (const char *)ASN1_STRING_get0_data(val->d.ia5);
        auto name_len = (size_t)ASN1_STRING_length(val->d.ia5);

        if (strlen(name) == name_len) {
          switch (type) {
          case GEN_DNS: dsn_matched = check_host_name(name, name_len); break;

          case GEN_IPADD:
            if (!memcmp(&addr6, name, addr_len) ||
                !memcmp(&addr, name, addr_len)) {
              ip_mached = true;
            }
            break;
          }
        }
      }
    }

    if (dsn_matched || ip_mached) { ret = true; }
  }

  GENERAL_NAMES_free((STACK_OF(GENERAL_NAME) *)alt_names);

  return ret;
}